

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O2

void device_reset_k053260(void *chip)

{
  long lVar1;
  
  *(undefined4 *)((long)chip + 0x20) = 0;
  *(undefined2 *)((long)chip + 0x24) = 0;
  for (lVar1 = 0x28; lVar1 != 200; lVar1 = lVar1 + 0x28) {
    KDSC_voice_reset((KDSC_Voice *)((long)chip + lVar1));
  }
  *(undefined8 *)((long)chip + 0xe0) = 0;
  return;
}

Assistant:

static void device_reset_k053260(void* chip)
{
	k053260_state *info = (k053260_state *)chip;
	int i;

	memset(info->portdata, 0, sizeof(info->portdata));

	info->keyon = 0;
	info->mode = 0;

	for (i = 0; i < 4; i++)
		KDSC_voice_reset(&info->voice[i]);

	RC_RESET(&info->cycleCntr);

	return;
}